

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O1

void __thiscall tl::Vector<anims::NodeData>::reserve(Vector<anims::NodeData> *this,size_t capacity)

{
  NodeData *__src;
  NodeData *__dest;
  
  if (this->_capacity < capacity) {
    __dest = (NodeData *)operator_new__(capacity * 0x18);
    __src = this->_data;
    if (__src != (NodeData *)0x0) {
      memcpy(__dest,__src,this->_size * 0x18);
      operator_delete__(__src);
    }
    this->_data = __dest;
    this->_capacity = capacity;
  }
  return;
}

Assistant:

void Vector<T>::reserve(size_t capacity)noexcept
{
    if(capacity > _capacity) {
        T* data = reinterpret_cast<T*>(new char[sizeof(T) * capacity]);
        if(_data) {
            memcpy(data, _data, _size * sizeof(T));
            delete[] (char*)_data;
        }
        _data = data;
        _capacity = capacity;
    }
}